

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-reno.c
# Opt level: O0

void reno_on_acked(quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t largest_acked,
                  uint32_t inflight,int64_t now,uint32_t max_udp_payload_size)

{
  uint uVar1;
  ulong in_RCX;
  uint in_EDX;
  long in_RDI;
  uint in_R8D;
  uint32_t count;
  
  if (in_R8D < in_EDX) {
    __assert_fail("inflight >= bytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/cc-reno.c"
                  ,0x1d,
                  "void reno_on_acked(quicly_cc_t *, const quicly_loss_t *, uint32_t, uint64_t, uint32_t, int64_t, uint32_t)"
                 );
  }
  if (*(ulong *)(in_RDI + 0x10) <= in_RCX) {
    if (*(uint *)(in_RDI + 8) < *(uint *)(in_RDI + 0xc)) {
      *(uint *)(in_RDI + 8) = in_EDX + *(int *)(in_RDI + 8);
      if (*(uint *)(in_RDI + 0x44) < *(uint *)(in_RDI + 8)) {
        *(undefined4 *)(in_RDI + 0x44) = *(undefined4 *)(in_RDI + 8);
      }
    }
    else {
      *(uint *)(in_RDI + 0x18) = in_EDX + *(int *)(in_RDI + 0x18);
      if (*(uint *)(in_RDI + 8) <= *(uint *)(in_RDI + 0x18)) {
        uVar1 = *(uint *)(in_RDI + 0x18) / *(uint *)(in_RDI + 8);
        *(uint *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) - uVar1 * *(int *)(in_RDI + 8);
        *(uint *)(in_RDI + 8) = uVar1 * (int)now + *(int *)(in_RDI + 8);
        if (*(uint *)(in_RDI + 0x44) < *(uint *)(in_RDI + 8)) {
          *(undefined4 *)(in_RDI + 0x44) = *(undefined4 *)(in_RDI + 8);
        }
      }
    }
  }
  return;
}

Assistant:

static void reno_on_acked(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t largest_acked, uint32_t inflight,
                          int64_t now, uint32_t max_udp_payload_size)
{
    assert(inflight >= bytes);
    /* Do not increase congestion window while in recovery. */
    if (largest_acked < cc->recovery_end)
        return;

    /* Slow start. */
    if (cc->cwnd < cc->ssthresh) {
        cc->cwnd += bytes;
        if (cc->cwnd_maximum < cc->cwnd)
            cc->cwnd_maximum = cc->cwnd;
        return;
    }
    /* Congestion avoidance. */
    cc->state.reno.stash += bytes;
    if (cc->state.reno.stash < cc->cwnd)
        return;
    /* Increase congestion window by 1 MSS per congestion window acked. */
    uint32_t count = cc->state.reno.stash / cc->cwnd;
    cc->state.reno.stash -= count * cc->cwnd;
    cc->cwnd += count * max_udp_payload_size;
    if (cc->cwnd_maximum < cc->cwnd)
        cc->cwnd_maximum = cc->cwnd;
}